

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ctype.c
# Opt level: O2

CType * lj_ctype_getfieldq(CTState *cts,CType *ct,GCstr *name,CTSize *ofs,CTInfo *qual)

{
  CType *pCVar1;
  CTSize CVar2;
  ulong uVar3;
  
  while( true ) {
    uVar3 = (ulong)ct->sib;
    if (uVar3 == 0) {
      return (CType *)0x0;
    }
    pCVar1 = cts->tab;
    ct = pCVar1 + uVar3;
    if ((GCstr *)pCVar1[uVar3].name.gcptr64 == name) break;
    if (((ct->info & 0xf0ff0000) == 0x80030000) &&
       (pCVar1 = lj_ctype_getfieldq(cts,pCVar1 + (ct->info & 0xffff),name,ofs,qual),
       pCVar1 != (CType *)0x0)) {
      if (qual != (CTInfo *)0x0) {
        *qual = *qual;
      }
      CVar2 = *ofs + ct->size;
      ct = pCVar1;
LAB_00144069:
      *ofs = CVar2;
      return ct;
    }
  }
  CVar2 = ct->size;
  goto LAB_00144069;
}

Assistant:

CType *lj_ctype_getfieldq(CTState *cts, CType *ct, GCstr *name, CTSize *ofs,
			  CTInfo *qual)
{
  while (ct->sib) {
    ct = ctype_get(cts, ct->sib);
    if (gcref(ct->name) == obj2gco(name)) {
      *ofs = ct->size;
      return ct;
    }
    if (ctype_isxattrib(ct->info, CTA_SUBTYPE)) {
      CType *fct, *cct = ctype_child(cts, ct);
      CTInfo q = 0;
      while (ctype_isattrib(cct->info)) {
	if (ctype_attrib(cct->info) == CTA_QUAL) q |= cct->size;
	cct = ctype_child(cts, cct);
      }
      fct = lj_ctype_getfieldq(cts, cct, name, ofs, qual);
      if (fct) {
	if (qual) *qual |= q;
	*ofs += ct->size;
	return fct;
      }
    }
  }
  return NULL;  /* Not found. */
}